

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

uint4 ActionLikelyTrash::countMarks(PcodeOp *op)

{
  bool bVar1;
  int4 iVar2;
  OpCode OVar3;
  PcodeOp *pPVar4;
  PcodeOp *defOp;
  Varnode *vn;
  int4 i;
  uint4 res;
  PcodeOp *op_local;
  
  vn._4_4_ = 0;
  vn._0_4_ = 0;
  do {
    iVar2 = PcodeOp::numInput(op);
    if (iVar2 <= (int)vn) {
      return vn._4_4_;
    }
    defOp = (PcodeOp *)PcodeOp::getIn(op,(int)vn);
    while (bVar1 = Varnode::isMark((Varnode *)defOp), !bVar1) {
      bVar1 = Varnode::isWritten((Varnode *)defOp);
      if (!bVar1) goto LAB_0065d1ac;
      pPVar4 = Varnode::getDef((Varnode *)defOp);
      if (pPVar4 == op) {
        vn._4_4_ = vn._4_4_ + 1;
        goto LAB_0065d1ac;
      }
      OVar3 = PcodeOp::code(pPVar4);
      if (OVar3 != CPUI_INDIRECT) goto LAB_0065d1ac;
      pPVar4 = Varnode::getDef((Varnode *)defOp);
      defOp = (PcodeOp *)PcodeOp::getIn(pPVar4,0);
    }
    vn._4_4_ = vn._4_4_ + 1;
LAB_0065d1ac:
    vn._0_4_ = (int)vn + 1;
  } while( true );
}

Assistant:

uint4 ActionLikelyTrash::countMarks(PcodeOp *op)

{
  uint4 res = 0;
  for(int4 i=0;i<op->numInput();++i) {
    Varnode *vn = op->getIn(i);
    for(;;) {
      if (vn->isMark()) {
	res += 1;
	break;
      }
      if (!vn->isWritten()) break;
      PcodeOp *defOp = vn->getDef();
      if (defOp == op) {	// We have looped all the way around
	res += 1;
	break;
      }
      else if (defOp->code() != CPUI_INDIRECT)	// Chain up through INDIRECTs
	break;
      vn = vn->getDef()->getIn(0);
    }
  }
  return res;
}